

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_algorithm_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SignatureAlgorithmTest_ParseDerRsaPssBadTrailer_Test::TestBody
          (SignatureAlgorithmTest_ParseDerRsaPssBadTrailer_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_a8;
  AssertHelper local_88 [3];
  Message local_70;
  Span<const_unsigned_char> local_68;
  Span<const_unsigned_char> local_58;
  _Optional_payload_base<bssl::SignatureAlgorithm> local_44;
  bool local_39;
  undefined1 local_38 [8];
  AssertionResult gtest_ar_;
  uint8_t kData [22];
  SignatureAlgorithmTest_ParseDerRsaPssBadTrailer_Test *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x8648862a09061430;
  Span<unsigned_char_const>::Span<22ul>
            ((Span<unsigned_char_const> *)&local_68,(uchar (*) [22])&gtest_ar_.message_);
  bssl::der::Input::Input((Input *)&local_58,local_68);
  local_44 = (_Optional_payload_base<bssl::SignatureAlgorithm>)
             ParseSignatureAlgorithm((Input)local_58);
  bVar1 = ::std::optional::operator_cast_to_bool((optional *)&local_44);
  local_39 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_38,&local_39,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)local_38,
               (AssertionResult *)"ParseSignatureAlgorithm(der::Input(kData))","true","false",in_R9)
    ;
    message = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/signature_algorithm_unittest.cc"
               ,0x289,message);
    testing::internal::AssertHelper::operator=(local_88,&local_70);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    ::std::__cxx11::string::~string((string *)&local_a8);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

TEST(SignatureAlgorithmTest, ParseDerRsaPssBadTrailer) {
  // clang-format off
  const uint8_t kData[] = {
      0x30, 0x14,  // SEQUENCE (20 bytes)
      0x06, 0x09,  // OBJECT IDENTIFIER (9 bytes)
      0x2A, 0x86, 0x48, 0x86, 0xF7, 0x0D, 0x01, 0x01, 0x0A,
      0x30, 0x07,  // SEQUENCE (7 bytes)
      0xA3, 0x05,  // [3] (5 bytes)
      0x02, 0x01,  // INTEGER (1 byte)
      0x01,
      0x05, 0x00,  // NULL (0 bytes)
  };
  // clang-format on
  EXPECT_FALSE(ParseSignatureAlgorithm(der::Input(kData)));
}